

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.hpp
# Opt level: O3

Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
__thiscall
rc::gen::detail::
ContainerHelper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::gen::detail::GenericContainerStrategy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>_>
::generate<char>(ContainerHelper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::gen::detail::GenericContainerStrategy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>_>
                 *this,Random *random,int size,Gen<char> *gens)

{
  undefined8 uVar1;
  Number NVar2;
  undefined8 *puVar3;
  long lVar4;
  undefined4 in_register_00000014;
  Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *shrinkable;
  unsigned_long *puVar5;
  Random *pRVar6;
  size_t in_R8;
  Shrinkables<char> shrinkables;
  Random r;
  Constant<bool> in_stack_ffffffffffffff18;
  anon_class_1_1_527bc8f1 local_e1;
  undefined8 local_e0;
  Random local_d8;
  Random local_80;
  
  puVar5 = (unsigned_long *)CONCAT44(in_register_00000014,size);
  pRVar6 = &local_80;
  for (lVar4 = 0xb; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pRVar6->m_key)._M_elems[0] = *puVar5;
    puVar5 = puVar5 + 1;
    pRVar6 = (Random *)((pRVar6->m_key)._M_elems + 1);
  }
  Random::split(&local_d8,&local_80);
  NVar2 = Random::next(&local_d8);
  generateShrinkables<char,rc::fn::Constant<bool>>
            ((Shrinkables<char> *)&local_d8,(detail *)&local_80,(Random *)((ulong)gens & 0xffffffff)
             ,(int)(NVar2 % (ulong)(long)((int)gens + 1)),in_R8,(Gen<char> *)0x1,
             in_stack_ffffffffffffff18);
  rc::shrinkable::
  shrinkRecur<std::vector<rc::Shrinkable<char>,std::allocator<rc::Shrinkable<char>>>,rc::gen::detail::ContainerHelper<std::__cxx11::string,rc::gen::detail::GenericContainerStrategy<std::__cxx11::string,false,false>>::generate<char>(rc::Random_const&,int,rc::Gen<char>const&)const::_lambda(std::vector<rc::Shrinkable<char>,std::allocator<rc::Shrinkable<char>>>const&)_1_>
            ((shrinkable *)&local_e0,
             (vector<rc::Shrinkable<char>,_std::allocator<rc::Shrinkable<char>_>_> *)&local_d8,
             &local_e1);
  puVar3 = (undefined8 *)operator_new(0x20);
  uVar1 = local_e0;
  *puVar3 = &PTR_value_001b2410;
  local_e0 = 0;
  puVar3[1] = toContainer<std::__cxx11::string,char>;
  puVar3[2] = uVar1;
  puVar3[3] = 1;
  *(undefined8 **)this = puVar3;
  std::vector<rc::Shrinkable<char>,_std::allocator<rc::Shrinkable<char>_>_>::~vector
            ((vector<rc::Shrinkable<char>,_std::allocator<rc::Shrinkable<char>_>_> *)&local_d8);
  return (Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )(IShrinkableImpl *)this;
}

Assistant:

Shrinkable<Container>
  generate(const Random &random, int size, const Gen<Ts> &... gens) const {
    const auto strategy = m_strategy;
    auto r = random;
    std::size_t count = r.split().next() % (size + 1);
    auto shrinkables = strategy.generateElements(r, size, count, gens...);

    using Elements = decltype(shrinkables);
    return shrinkable::map(
        shrinkable::shrinkRecur(std::move(shrinkables),
                                [=](const Elements &elements) {
                                  return seq::concat(
                                      shrink::removeChunks(elements),
                                      strategy.shrinkElements(elements));
                                }),
        &toContainer<Container, typename Elements::value_type::ValueType>);
  }